

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O1

int ON_JoinCurvesOld(ON_SimpleArray<const_ON_Curve_*> *InCurves,
                    ON_SimpleArray<ON_Curve_*> *OutCurves,double join_tol,bool bPreserveDirection,
                    ON_SimpleArray<int> *key)

{
  ON_SimpleArray<OldCurveJoinSeg> *SArray;
  int iVar1;
  int *piVar2;
  ON_SimpleArray<int> *this;
  undefined4 uVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  long lVar11;
  OldCurveJoinEndData *pOVar12;
  void *__s;
  void *pvVar13;
  void *pvVar14;
  long lVar15;
  ON_SimpleArray<OldCurveJoinSeg> *pOVar16;
  OldCurveJoinSeg *pOVar17;
  OldCurveJoinSeg *pOVar18;
  OldCurveJoinSeg this_00;
  ON_NurbsCurve *pOVar19;
  undefined8 extraout_RAX;
  ON_PolyCurve *this_01;
  ON_Curve *pOVar20;
  undefined4 extraout_var_00;
  double *pdVar21;
  undefined7 in_register_00000011;
  size_t sVar22;
  ON_SimpleArray<ON_Curve_*> *pOVar23;
  size_t new_capacity;
  long lVar24;
  ON_SimpleArray<ON_Curve_*> *this_02;
  int si;
  ulong uVar25;
  ON_SimpleArray<OldCurveJoinSeg> *this_03;
  long lVar26;
  bool bVar27;
  ON_Interval OVar28;
  ON_Curve *C_1;
  ON_SimpleArray<ON_Curve_*> IC;
  OldCurveJoinSeg Seg;
  ON_SimpleArray<OldCurveJoinEndData> EData;
  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> SegsArray;
  ON_3dPointArray Start;
  ON_SimpleArray<int> cmap;
  ON_3dPointArray End;
  ON_3dPoint Q;
  uint local_1a4;
  void *local_1a0;
  double local_198;
  ON_NurbsCurve *local_190;
  ON_SimpleArray<ON_Curve_*> local_188;
  int local_16c;
  undefined1 local_168 [8];
  double dStack_160;
  double local_158;
  double local_150;
  ON_SimpleArray<int> *local_148;
  undefined4 local_140;
  uint local_13c;
  undefined1 local_138 [16];
  double local_128;
  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> local_120;
  ON_SimpleArray<ON_Curve_*> *local_108;
  int local_fc;
  ON_SimpleArray<ON_3dPoint> local_f8;
  ON_SimpleArray<int> local_e0;
  ON_SimpleArray<ON_3dPoint> local_c8;
  void *local_b0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  iVar10 = 0;
  if (0 < InCurves->m_count) {
    local_140 = (undefined4)CONCAT71(in_register_00000011,bPreserveDirection);
    iVar10 = OutCurves->m_count;
    local_150 = join_tol;
    local_148 = key;
    local_108 = OutCurves;
    iVar7 = (*((*InCurves->m_a)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
    local_1a4 = 1;
    uVar9 = InCurves->m_count;
    if (1 < (int)uVar9) {
      do {
        iVar8 = (*(InCurves->m_a[(int)local_1a4]->super_ON_Geometry).super_ON_Object._vptr_ON_Object
                  [0x18])();
        if (iVar8 != iVar7) {
          return 0;
        }
        local_1a4 = local_1a4 + 1;
        uVar9 = InCurves->m_count;
      } while ((int)local_1a4 < (int)uVar9);
    }
    pOVar23 = local_108;
    this = local_148;
    local_fc = iVar10;
    if (local_148 != (ON_SimpleArray<int> *)0x0) {
      if ((uint)local_148->m_capacity < uVar9) {
        ON_SimpleArray<int>::SetCapacity(local_148,(long)(int)uVar9);
      }
      local_1a4 = 0;
      if (0 < InCurves->m_count) {
        do {
          local_188._vptr_ON_SimpleArray =
               (_func_int **)CONCAT44(local_188._vptr_ON_SimpleArray._4_4_,0xffffffff);
          ON_SimpleArray<int>::Append(this,(int *)&local_188);
          local_1a4 = local_1a4 + 1;
        } while ((int)local_1a4 < InCurves->m_count);
      }
    }
    if ((uint)pOVar23->m_capacity < (uint)InCurves->m_count) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity(pOVar23,(long)InCurves->m_count);
    }
    local_188._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081ad30;
    local_188.m_a = (ON_Curve **)0x0;
    local_188.m_count = 0;
    local_188.m_capacity = 0;
    if ((long)InCurves->m_count != 0) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_188,(long)InCurves->m_count);
    }
    local_e0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
    local_e0.m_a = (int *)0x0;
    local_e0.m_count = 0;
    local_e0.m_capacity = 0;
    if ((long)InCurves->m_count != 0) {
      ON_SimpleArray<int>::SetCapacity(&local_e0,(long)InCurves->m_count);
    }
    local_1a4 = 0;
    if (0 < InCurves->m_count) {
      do {
        iVar10 = (*(InCurves->m_a[(int)local_1a4]->super_ON_Geometry).super_ON_Object.
                   _vptr_ON_Object[0x24])();
        local_f8._vptr_ON_SimpleArray = (_func_int **)CONCAT44(extraout_var,iVar10);
        if (local_f8._vptr_ON_SimpleArray != (_func_int **)0x0) {
          cVar4 = (**(code **)(*local_f8._vptr_ON_SimpleArray + 0x1a0))
                            (local_f8._vptr_ON_SimpleArray);
          if (cVar4 == '\0') {
            ON_SimpleArray<int>::Append(&local_e0,(int *)&local_1a4);
            this_02 = &local_188;
          }
          else {
            this_02 = pOVar23;
            if (this != (ON_SimpleArray<int> *)0x0) {
              this->m_a[(int)local_1a4] = pOVar23->m_count;
            }
          }
          ON_SimpleArray<ON_Curve_*>::Append(this_02,(ON_Curve **)&local_f8);
        }
        local_1a4 = local_1a4 + 1;
      } while ((int)local_1a4 < InCurves->m_count);
    }
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_f8,local_188.m_count);
    uVar3 = local_140;
    if ((-1 < local_188.m_count) && (local_188.m_count <= local_f8.m_capacity)) {
      local_f8.m_count = local_188.m_count;
    }
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_c8,local_188.m_count);
    if ((-1 < local_188.m_count) && (local_188.m_count <= local_c8.m_capacity)) {
      local_c8.m_count = local_188.m_count;
    }
    local_1a4 = 0;
    if (0 < local_188.m_count) {
      do {
        ON_Curve::PointAtStart((ON_3dPoint *)local_138,local_188.m_a[(int)local_1a4]);
        lVar11 = (long)(int)local_1a4;
        local_f8.m_a[lVar11].z = local_128;
        local_f8.m_a[lVar11].x = (double)local_138._0_8_;
        local_f8.m_a[lVar11].y = (double)local_138._8_8_;
        ON_Curve::PointAtEnd((ON_3dPoint *)local_138,local_188.m_a[lVar11]);
        local_c8.m_a[(int)local_1a4].z = local_128;
        local_c8.m_a[(int)local_1a4].x = (double)local_138._0_8_;
        local_c8.m_a[(int)local_1a4].y = (double)local_138._8_8_;
        local_1a4 = local_1a4 + 1;
      } while ((int)local_1a4 < local_188.m_count);
    }
    local_138._0_8_ = &PTR__ON_SimpleArray_0081cd70;
    local_138._8_8_ = (OldCurveJoinEndData *)0x0;
    local_128 = 0.0;
    if (local_188.m_count != 0) {
      ON_SimpleArray<OldCurveJoinEndData>::SetCapacity
                ((ON_SimpleArray<OldCurveJoinEndData> *)local_138,(long)local_188.m_count);
    }
    local_1a4 = 0;
    if (0 < local_188.m_count) {
      do {
        if (0 < local_188.m_count) {
          lVar11 = 0;
          uVar25 = 0;
          do {
            if (uVar25 != local_1a4) {
              local_198 = ON_3dPoint::DistanceTo
                                    (local_f8.m_a + (int)local_1a4,
                                     (ON_3dPoint *)((long)&(local_c8.m_a)->x + lVar11));
              iVar10 = (int)uVar25;
              if (local_198 <= local_150) {
                pOVar12 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew
                                    ((ON_SimpleArray<OldCurveJoinEndData> *)local_138);
                pOVar12->id[0] = local_1a4;
                pOVar12->end[0] = 0;
                pOVar12->end[1] = 1;
                pOVar12->id[1] = iVar10;
                pOVar12->dist = local_198;
              }
              if (((char)uVar3 == '\0') && ((long)(int)local_1a4 < (long)uVar25)) {
                local_198 = ON_3dPoint::DistanceTo
                                      (local_f8.m_a + (int)local_1a4,
                                       (ON_3dPoint *)((long)&(local_f8.m_a)->x + lVar11));
                if (local_198 <= local_150) {
                  pOVar12 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew
                                      ((ON_SimpleArray<OldCurveJoinEndData> *)local_138);
                  pOVar12->id[0] = local_1a4;
                  pOVar12->end[0] = 0;
                  pOVar12->end[1] = 0;
                  pOVar12->id[1] = iVar10;
                  pOVar12->dist = local_198;
                }
                local_198 = ON_3dPoint::DistanceTo
                                      (local_c8.m_a + (int)local_1a4,
                                       (ON_3dPoint *)((long)&(local_c8.m_a)->x + lVar11));
                if (local_198 <= local_150) {
                  pOVar12 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew
                                      ((ON_SimpleArray<OldCurveJoinEndData> *)local_138);
                  pOVar12->id[0] = local_1a4;
                  pOVar12->end[0] = 1;
                  pOVar12->end[1] = 1;
                  pOVar12->id[1] = iVar10;
                  pOVar12->dist = local_198;
                }
              }
            }
            uVar25 = uVar25 + 1;
            lVar11 = lVar11 + 0x18;
          } while ((long)uVar25 < (long)local_188.m_count);
        }
        local_1a4 = local_1a4 + 1;
      } while ((int)local_1a4 < local_188.m_count);
    }
    if ((OldCurveJoinEndData *)local_138._8_8_ != (OldCurveJoinEndData *)0x0) {
      if (1 < (long)local_128._0_4_) {
        ON_qsort((void *)local_138._8_8_,(long)local_128._0_4_,0x18,OldCompareEndData);
      }
    }
    __s = onmalloc((long)local_188.m_count << 3);
    sVar22 = 0;
    memset(__s,0,(long)local_188.m_count << 3);
    pvVar13 = onmalloc((long)local_188.m_count << 3);
    new_capacity = (size_t)local_188.m_count;
    if (0 < (long)new_capacity) {
      sVar22 = 0;
      pvVar14 = __s;
      do {
        *(void **)((long)pvVar13 + sVar22 * 8) = pvVar14;
        sVar22 = sVar22 + 1;
        pvVar14 = (void *)((long)pvVar14 + 8);
      } while (new_capacity != sVar22);
    }
    local_1a4 = (uint)sVar22;
    local_120._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0081cdb0;
    local_120.m_a = (ON_SimpleArray<OldCurveJoinSeg> *)0x0;
    local_120.m_count = 0;
    local_120.m_capacity = 0;
    local_b0 = __s;
    if (local_188.m_count != 0) {
      ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::SetCapacity(&local_120,new_capacity);
    }
    local_1a4 = 0;
    local_1a0 = pvVar13;
    if (0 < local_128._0_4_) {
      do {
        pOVar16 = local_120.m_a;
        lVar15 = (long)(int)local_1a4;
        lVar11 = *(long *)((long)pvVar13 +
                          (long)((OldCurveJoinEndData *)(local_138._8_8_ + lVar15 * 0x18))->id[0] *
                          8);
        if (*(int *)(lVar11 + (long)((OldCurveJoinEndData *)(local_138._8_8_ + lVar15 * 0x18))->end
                                    [0] * 4) < 1) {
          pOVar12 = (OldCurveJoinEndData *)(local_138._8_8_ + lVar15 * 0x18);
          iVar10 = pOVar12->id[1];
          lVar26 = *(long *)((long)pvVar13 + (long)iVar10 * 8);
          lVar24 = (long)pOVar12->end[1];
          if (*(int *)(lVar26 + lVar24 * 4) < 1) {
            iVar7 = *(int *)(lVar11 + (1 - (long)((OldCurveJoinEndData *)
                                                 (local_138._8_8_ + lVar15 * 0x18))->end[0]) * 4);
            lVar11 = (long)iVar7;
            iVar8 = *(int *)(lVar26 + (1 - lVar24) * 4);
            pvVar13 = local_1a0;
            if (lVar11 == 0) {
              if (iVar8 == 0) {
                *(int *)(lVar26 + lVar24 * 4) = local_120.m_count + 1;
                *(int *)(*(long *)((long)local_1a0 + (long)pOVar12->id[0] * 8) +
                        (long)pOVar12->end[0] * 4) = local_120.m_count + 1;
                pOVar16 = ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::AppendNew(&local_120);
                if ((uint)pOVar16->m_capacity < 4) {
                  ON_SimpleArray<OldCurveJoinSeg>::SetCapacity(pOVar16,4);
                }
                pOVar17 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(pOVar16);
                pOVar18 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(pOVar16);
                if (pOVar12->end[0] != 0) {
                  pOVar17->id = pOVar12->id[0];
                  pOVar17->bRev = false;
                  goto LAB_0042d70d;
                }
                pOVar18->id = pOVar12->id[0];
                pOVar18->bRev = false;
                pOVar17->id = pOVar12->id[1];
                pOVar17->bRev = pOVar12->end[1] == 0;
              }
              else {
                *(int *)(lVar26 + lVar24 * 4) = iVar8;
                *(int *)(*(long *)((long)local_1a0 + (long)pOVar12->id[0] * 8) +
                        (long)pOVar12->end[0] * 4) = iVar8;
                if ((local_120.m_a[(long)iVar8 + -1].m_a)->id == pOVar12->id[1]) {
                  local_168[4] = pOVar12->end[0] == 0;
                  local_168._0_4_ = pOVar12->id[0];
                  ON_SimpleArray<OldCurveJoinSeg>::Insert
                            (local_120.m_a + (long)iVar8 + -1,0,(OldCurveJoinSeg *)local_168);
                  pvVar13 = local_1a0;
                }
                else {
                  pOVar17 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew
                                      (local_120.m_a + (long)iVar8 + -1);
                  pOVar17->id = pOVar12->id[0];
                  pOVar17->bRev = pOVar12->end[0] != 0;
                  pvVar13 = local_1a0;
                }
              }
            }
            else if (iVar8 == 0) {
              *(int *)(lVar26 + lVar24 * 4) = iVar7;
              *(int *)(*(long *)((long)local_1a0 + (long)pOVar12->id[0] * 8) +
                      (long)pOVar12->end[0] * 4) = iVar7;
              if ((local_120.m_a[lVar11 + -1].m_a)->id == pOVar12->id[0]) {
                local_168[4] = pOVar12->end[1] == 0;
                local_168._0_4_ = pOVar12->id[1];
                ON_SimpleArray<OldCurveJoinSeg>::Insert
                          (local_120.m_a + lVar11 + -1,0,(OldCurveJoinSeg *)local_168);
              }
              else {
                pOVar18 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(local_120.m_a + lVar11 + -1);
LAB_0042d70d:
                pOVar18->id = pOVar12->id[1];
                pOVar18->bRev = pOVar12->end[1] != 0;
              }
            }
            else if (iVar7 == iVar8) {
              *(int *)(lVar26 + lVar24 * 4) = iVar7;
              *(int *)(*(long *)((long)local_1a0 + (long)pOVar12->id[0] * 8) +
                      (long)pOVar12->end[0] * 4) = iVar7;
            }
            else {
              this_03 = local_120.m_a + lVar11 + -1;
              SArray = local_120.m_a + (long)iVar8 + -1;
              iVar1 = SArray->m_a->id;
              if ((local_120.m_a[lVar11 + -1].m_a)->id ==
                  ((OldCurveJoinEndData *)(local_138._8_8_ + lVar15 * 0x18))->id[0]) {
                if (iVar1 != iVar10) {
                  if (0 < local_120.m_a[lVar11 + -1].m_count) {
                    lVar26 = 0;
                    lVar15 = 0;
                    do {
                      pOVar17 = pOVar16[lVar11 + -1].m_a;
                      piVar2 = *(int **)((long)local_1a0 +
                                        (long)*(int *)((long)&pOVar17->id + lVar26) * 8);
                      if (0 < *piVar2) {
                        *piVar2 = iVar8;
                      }
                      pOVar17 = (OldCurveJoinSeg *)((long)&pOVar17->id + lVar26);
                      lVar24 = *(long *)((long)local_1a0 + (long)pOVar17->id * 8);
                      if (0 < *(int *)(lVar24 + 4)) {
                        *(int *)(lVar24 + 4) = iVar8;
                      }
                      ON_SimpleArray<OldCurveJoinSeg>::Append(SArray,pOVar17);
                      lVar15 = lVar15 + 1;
                      lVar26 = lVar26 + 8;
                    } while (lVar15 < pOVar16[lVar11 + -1].m_count);
                  }
                  *(int *)(*(long *)((long)local_1a0 + (long)pOVar12->id[1] * 8) +
                          (long)pOVar12->end[1] * 4) = iVar8;
                  *(int *)(*(long *)((long)local_1a0 + (long)pOVar12->id[0] * 8) +
                          (long)pOVar12->end[0] * 4) = iVar8;
                  pvVar13 = local_1a0;
                  if (-1 < pOVar16[lVar11 + -1].m_capacity) {
                    pOVar16[lVar11 + -1].m_count = 0;
                  }
                  goto LAB_0042d4ba;
                }
                OldReverseSegs(this_03);
                if (0 < pOVar16[(long)iVar8 + -1].m_count) {
                  lVar15 = 0;
                  lVar11 = 0;
                  do {
                    pOVar17 = pOVar16[(long)iVar8 + -1].m_a;
                    piVar2 = *(int **)((long)local_1a0 +
                                      (long)*(int *)((long)&pOVar17->id + lVar15) * 8);
                    if (0 < *piVar2) {
                      *piVar2 = iVar7;
                    }
                    pOVar17 = (OldCurveJoinSeg *)((long)&pOVar17->id + lVar15);
                    lVar26 = *(long *)((long)local_1a0 + (long)pOVar17->id * 8);
                    if (0 < *(int *)(lVar26 + 4)) {
                      *(int *)(lVar26 + 4) = iVar7;
                    }
                    ON_SimpleArray<OldCurveJoinSeg>::Append(this_03,pOVar17);
                    lVar11 = lVar11 + 1;
                    lVar15 = lVar15 + 8;
                  } while (lVar11 < pOVar16[(long)iVar8 + -1].m_count);
                }
              }
              else if (iVar1 == iVar10) {
                if (0 < local_120.m_a[(long)iVar8 + -1].m_count) {
                  lVar15 = 0;
                  lVar11 = 0;
                  do {
                    pOVar17 = pOVar16[(long)iVar8 + -1].m_a;
                    piVar2 = *(int **)((long)local_1a0 +
                                      (long)*(int *)((long)&pOVar17->id + lVar15) * 8);
                    if (0 < *piVar2) {
                      *piVar2 = iVar7;
                    }
                    pOVar17 = (OldCurveJoinSeg *)((long)&pOVar17->id + lVar15);
                    lVar26 = *(long *)((long)local_1a0 + (long)pOVar17->id * 8);
                    if (0 < *(int *)(lVar26 + 4)) {
                      *(int *)(lVar26 + 4) = iVar7;
                    }
                    ON_SimpleArray<OldCurveJoinSeg>::Append(this_03,pOVar17);
                    lVar11 = lVar11 + 1;
                    lVar15 = lVar15 + 8;
                  } while (lVar11 < pOVar16[(long)iVar8 + -1].m_count);
                }
              }
              else {
                OldReverseSegs(SArray);
                if (0 < pOVar16[(long)iVar8 + -1].m_count) {
                  lVar15 = 0;
                  lVar11 = 0;
                  do {
                    pOVar17 = pOVar16[(long)iVar8 + -1].m_a;
                    piVar2 = *(int **)((long)local_1a0 +
                                      (long)*(int *)((long)&pOVar17->id + lVar15) * 8);
                    if (0 < *piVar2) {
                      *piVar2 = iVar7;
                    }
                    pOVar17 = (OldCurveJoinSeg *)((long)&pOVar17->id + lVar15);
                    lVar26 = *(long *)((long)local_1a0 + (long)pOVar17->id * 8);
                    if (0 < *(int *)(lVar26 + 4)) {
                      *(int *)(lVar26 + 4) = iVar7;
                    }
                    ON_SimpleArray<OldCurveJoinSeg>::Append(this_03,pOVar17);
                    lVar11 = lVar11 + 1;
                    lVar15 = lVar15 + 8;
                  } while (lVar11 < pOVar16[(long)iVar8 + -1].m_count);
                }
              }
              *(int *)(*(long *)((long)local_1a0 + (long)pOVar12->id[1] * 8) +
                      (long)pOVar12->end[1] * 4) = iVar7;
              *(int *)(*(long *)((long)local_1a0 + (long)pOVar12->id[0] * 8) +
                      (long)pOVar12->end[0] * 4) = iVar7;
              pvVar13 = local_1a0;
              if (-1 < pOVar16[(long)iVar8 + -1].m_capacity) {
                pOVar16[(long)iVar8 + -1].m_count = 0;
              }
            }
          }
        }
LAB_0042d4ba:
        local_1a4 = local_1a4 + 1;
      } while ((int)local_1a4 < local_128._0_4_);
    }
    local_1a4 = 0;
    pOVar23 = local_108;
    if (0 < local_120.m_count) {
      do {
        iVar10 = local_120.m_a[(int)local_1a4].m_count;
        if (1 < (long)iVar10) {
          pOVar16 = local_120.m_a + (int)local_1a4;
          if ((char)local_140 == '\0') {
            lVar11 = 0;
            iVar7 = 0;
            do {
              iVar7 = iVar7 + (uint)pOVar16->m_a[lVar11].bRev;
              lVar11 = lVar11 + 1;
            } while (iVar10 != lVar11);
            if (iVar10 < iVar7 * 2) {
              OldReverseSegs(pOVar16);
            }
          }
          this_00 = (OldCurveJoinSeg)operator_new(0x40);
          ON_PolyCurve::ON_PolyCurve((ON_PolyCurve *)this_00,pOVar16->m_count);
          if (pOVar16->m_count < 1) {
            uVar9 = 0;
            local_16c = 0;
            bVar27 = false;
          }
          else {
            lVar11 = 0;
            local_198 = (double)CONCAT44(local_198._4_4_,0xffffffff);
            lVar15 = 1;
            local_16c = 0;
            local_13c = 0;
            do {
              if (local_148 != (ON_SimpleArray<int> *)0x0) {
                local_148->m_a[local_e0.m_a[pOVar16->m_a[lVar11].id]] = pOVar23->m_count;
              }
              local_190 = (ON_NurbsCurve *)local_188.m_a[pOVar16->m_a[lVar11].id];
              if ((local_198._0_4_ < 0) ||
                 (iVar10 = local_198._0_4_, pOVar16->m_a[lVar11].id < local_198._0_4_)) {
                iVar10 = pOVar16->m_a[lVar11].id;
                local_16c = (int)lVar11;
              }
              local_198 = (double)CONCAT44(local_198._4_4_,iVar10);
              if (pOVar16->m_a[lVar11].bRev == true) {
                (*(local_190->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x38])();
              }
              iVar10 = ON_PolyCurve::Count((ON_PolyCurve *)this_00);
              if (iVar10 == 0) {
LAB_0042dc24:
                this_01 = ON_PolyCurve::Cast((ON_Object *)local_190);
                if (this_01 == (ON_PolyCurve *)0x0) {
                  bVar27 = true;
                  ON_PolyCurve::Append((ON_PolyCurve *)this_00,&local_190->super_ON_Curve);
                }
                else {
                  for (iVar10 = 0; iVar7 = ON_PolyCurve::Count(this_01), iVar10 < iVar7;
                      iVar10 = iVar10 + 1) {
                    pOVar20 = ON_PolyCurve::SegmentCurve(this_01,iVar10);
                    iVar7 = (*(pOVar20->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])
                                      (pOVar20);
                    if ((ON_Curve *)CONCAT44(extraout_var_00,iVar7) != (ON_Curve *)0x0) {
                      ON_PolyCurve::Append
                                ((ON_PolyCurve *)this_00,(ON_Curve *)CONCAT44(extraout_var_00,iVar7)
                                );
                    }
                  }
                  (*(this_01->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                            (this_01);
                  bVar27 = true;
                }
              }
              else {
                bVar5 = ON_ForceMatchCurveEnds((ON_Curve *)this_00,1,&local_190->super_ON_Curve,0);
                bVar27 = true;
                if (!bVar5) {
                  ON_Curve::PointAtEnd((ON_3dPoint *)local_168,(ON_Curve *)this_00);
                  ON_Curve::PointAtStart(&local_60,&local_190->super_ON_Curve);
                  ON_3dPoint::operator+(&local_48,(ON_3dPoint *)local_168,&local_60);
                  operator*(&local_a8,0.5,&local_48);
                  local_158 = local_a8.z;
                  local_168 = (undefined1  [8])local_a8.x;
                  dStack_160 = local_a8.y;
                  cVar4 = (**(code **)(*(long *)this_00 + 0x1d0))(this_00);
                  if (cVar4 != '\0') {
                    iVar10 = (*(local_190->super_ON_Curve).super_ON_Geometry.super_ON_Object.
                               _vptr_ON_Object[0x39])();
                    bVar27 = true;
                    if ((char)iVar10 != '\0') goto LAB_0042dc20;
                  }
                  pOVar19 = ON_Curve::NurbsCurve
                                      (&local_190->super_ON_Curve,(ON_NurbsCurve *)0x0,0.0,
                                       (ON_Interval *)0x0);
                  if (pOVar19 != (ON_NurbsCurve *)0x0) {
                    iVar10 = (*(pOVar19->super_ON_Curve).super_ON_Geometry.super_ON_Object.
                               _vptr_ON_Object[0x39])(pOVar19);
                    if ((char)iVar10 != '\0') {
                      if (local_190 != (ON_NurbsCurve *)0x0) {
                        (*(local_190->super_ON_Curve).super_ON_Geometry.super_ON_Object.
                          _vptr_ON_Object[4])();
                      }
                      bVar27 = true;
                      local_190 = pOVar19;
                      goto LAB_0042dc20;
                    }
                    (*(pOVar19->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4]
                    )(pOVar19);
                  }
                  iVar10 = ON_PolyCurve::Count((ON_PolyCurve *)this_00);
                  if (iVar10 != 0) {
                    local_a8.x = (double)this_00;
                    ON_SimpleArray<ON_Curve_*>::Append(pOVar23,(ON_Curve **)&local_a8);
                    local_13c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  }
                  if (local_148 != (ON_SimpleArray<int> *)0x0) {
                    local_148->m_a[local_e0.m_a[pOVar16->m_a[lVar11].id]] =
                         local_148->m_a[local_e0.m_a[pOVar16->m_a[lVar11].id]] + 1;
                  }
                  ON_SimpleArray<ON_Curve_*>::Append(pOVar23,(ON_Curve **)&local_190);
                  for (lVar26 = lVar15; lVar26 < pOVar16->m_count; lVar26 = lVar26 + 1) {
                    if (local_148 != (ON_SimpleArray<int> *)0x0) {
                      local_148->m_a[local_e0.m_a[pOVar16->m_a[lVar26].id]] = pOVar23->m_count;
                    }
                    ON_SimpleArray<ON_Curve_*>::Append
                              (pOVar23,local_188.m_a + pOVar16->m_a[lVar26].id);
                  }
                  bVar27 = false;
                }
LAB_0042dc20:
                if (bVar27) goto LAB_0042dc24;
                bVar27 = false;
              }
              pOVar23 = local_108;
              if (!bVar27) break;
              lVar11 = lVar11 + 1;
              lVar15 = lVar15 + 1;
            } while (lVar11 < pOVar16->m_count);
            bVar27 = -1 < local_198._0_4_;
            uVar9 = local_13c;
          }
          iVar10 = ON_PolyCurve::Count((ON_PolyCurve *)this_00);
          pvVar13 = local_1a0;
          if (iVar10 == 0) {
            (**(code **)(*(long *)this_00 + 0x20))(this_00);
          }
          else if ((uVar9 & 1) == 0) {
            cVar4 = (**(code **)(*(long *)this_00 + 0x1a0))(this_00);
            if (((cVar4 == '\0') &&
                (bVar5 = ON_Curve::IsClosable((ON_Curve *)this_00,local_150,0.0,10.0), bVar5)) &&
               (bVar5 = ON_ForceMatchCurveEnds((ON_Curve *)this_00,0,(ON_Curve *)this_00,1), !bVar5)
               ) {
              ON_Curve::PointAtStart(&local_78,(ON_Curve *)this_00);
              (**(code **)(*(long *)this_00 + 0x1d0))(this_00);
            }
            bVar6 = (**(code **)(*(long *)this_00 + 0x1a0))(this_00);
            if ((bVar6 & bVar27) == 1) {
              OVar28 = ON_PolyCurve::SegmentDomain((ON_PolyCurve *)this_00,local_16c);
              dStack_160 = OVar28.m_t[1];
              local_168 = OVar28.m_t[0];
              pdVar21 = ON_Interval::operator[]((ON_Interval *)local_168,0);
              (**(code **)(*(long *)this_00 + 0x138))(SUB84(*pdVar21,0),this_00);
            }
            ON_PolyCurve::RemoveNesting((ON_PolyCurve *)this_00);
            ON_PolyCurve::SynchronizeSegmentDomains((ON_PolyCurve *)this_00);
            local_168 = (undefined1  [8])this_00;
            ON_SimpleArray<ON_Curve_*>::Append(pOVar23,(ON_Curve **)local_168);
          }
        }
        local_1a4 = local_1a4 + 1;
      } while ((int)local_1a4 < local_120.m_count);
    }
    local_1a4 = 0;
    if (0 < local_188.m_count) {
      do {
        piVar2 = *(int **)((long)pvVar13 + (long)(int)local_1a4 * 8);
        if ((*piVar2 == 0) && (piVar2[1] == 0)) {
          if (local_148 != (ON_SimpleArray<int> *)0x0) {
            local_148->m_a[local_e0.m_a[(int)local_1a4]] = pOVar23->m_count;
          }
          ON_SimpleArray<ON_Curve_*>::Append(pOVar23,local_188.m_a + (int)local_1a4);
        }
        local_1a4 = local_1a4 + 1;
      } while ((int)local_1a4 < local_188.m_count);
    }
    local_1a4 = 0;
    if (0 < pOVar23->m_count) {
      do {
        pOVar20 = pOVar23->m_a[(int)local_1a4];
        if (((pOVar20 != (ON_Curve *)0x0) &&
            (iVar10 = (*(pOVar20->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(pOVar20)
            , (char)iVar10 == '\0')) &&
           (bVar27 = ON_Curve::IsClosable(pOVar20,local_150,0.0,10.0), bVar27)) {
          ON_Curve::PointAtStart(&local_90,pOVar20);
          (*(pOVar20->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])(pOVar20);
        }
        local_1a4 = local_1a4 + 1;
      } while ((int)local_1a4 < pOVar23->m_count);
    }
    onfree(pvVar13);
    onfree(local_b0);
    iVar10 = pOVar23->m_count - local_fc;
    ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::~ON_ClassArray(&local_120);
    ON_SimpleArray<OldCurveJoinEndData>::~ON_SimpleArray
              ((ON_SimpleArray<OldCurveJoinEndData> *)local_138);
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_c8);
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_f8);
    ON_SimpleArray<int>::~ON_SimpleArray(&local_e0);
    ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_188);
  }
  return iVar10;
}

Assistant:

int 
ON_JoinCurvesOld(const ON_SimpleArray<const ON_Curve*>& InCurves,
  ON_SimpleArray<ON_Curve*>& OutCurves,
  double join_tol,
  bool bPreserveDirection, // = false
  ON_SimpleArray<int>* key //=0
)

{

  int i, count = OutCurves.Count();
  if (InCurves.Count() < 1)
    return 0;

  int dim = InCurves[0]->Dimension();
  for (i=1; i<InCurves.Count(); i++){
    if (InCurves[i]->Dimension() != dim) return 0;
  }

  if (key) {
    key->Reserve(InCurves.Count());
    for (i=0; i<InCurves.Count(); i++) key->Append(-1);
  }

  //Copy curves, take out closed curves. 
  OutCurves.Reserve(InCurves.Count());
  ON_SimpleArray<ON_Curve*> IC(InCurves.Count());
  ON_SimpleArray<int> cmap(InCurves.Count());
  for (i=0; i<InCurves.Count(); i++){
    ON_Curve* C = InCurves[i]->DuplicateCurve();
    if (!C) continue;
    if (C->IsClosed()) {
      if (key) (*key)[i] = OutCurves.Count();
      OutCurves.Append(C);
    }
    else {
      cmap.Append(i);
      IC.Append(C);
    }
  }

  //IC is a list of copies of all open curves.  match endpoints and join into polycurves.
  //copy curves that are not joined.
  ON_3dPointArray Start(IC.Count());
  Start.SetCount(IC.Count());
  ON_3dPointArray End(IC.Count());
  End.SetCount(IC.Count());
  for (i=0; i<IC.Count(); i++){
    Start[i] = IC[i]->PointAtStart();
    End[i] = IC[i]->PointAtEnd();
  }

  //get a list of all possible joins
  ON_SimpleArray<OldCurveJoinEndData> EData(IC.Count());
  for (i=0; i<IC.Count(); i++){
    int j;
    for (j=0; j<IC.Count(); j++){
      if (i==j) continue;
      double dist = Start[i].DistanceTo(End[j]);
      if (dist <= join_tol){
        OldCurveJoinEndData& ED = EData.AppendNew();
        ED.id[0] = i;
        ED.end[0] = 0;
        ED.id[1] = j;
        ED.end[1] = 1;
        ED.dist = dist;
      }
      if (!bPreserveDirection && i<j){
        dist = Start[i].DistanceTo(Start[j]);
        if (dist <= join_tol){
          OldCurveJoinEndData& ED = EData.AppendNew();
          ED.id[0] = i;
          ED.end[0] = 0;
          ED.id[1] = j;
          ED.end[1] = 0;
          ED.dist = dist;
        }
        dist = End[i].DistanceTo(End[j]);
        if (dist <= join_tol){
          OldCurveJoinEndData& ED = EData.AppendNew();
          ED.id[0] = i;
          ED.end[0] = 1;
          ED.id[1] = j;
          ED.end[1] = 1;
          ED.dist = dist;
        }
      }
    }
  }

  //sort possibilities by distance
  EData.QuickSort(OldCompareEndData);

  int* endspace = (int*)onmalloc(2*sizeof(int)*IC.Count());
  memset(endspace, 0, 2*sizeof(int)*IC.Count());
  int** endarray = (int**)onmalloc(sizeof(int*)*IC.Count());

  //endarray[i] is an int[2].  if endarray[i][0] > 0, then IC[i] is part of
  //polycurve endarray[i][0] - 1, and the start of IC[i] is interior to the polycurve.
  //if endarray[i][1] > 0, then the end of IC[i] is interior.  if both endarray[i][0] > 0
  //and endarray[i][1] > 0, then they are equal.

  for (i=0; i<IC.Count(); i++)
    endarray[i] = &endspace[2*i];

  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg> > SegsArray(IC.Count());

  for (i=0; i<EData.Count(); i++){
    const OldCurveJoinEndData& ED = EData[i];
    if (endarray[ED.id[0]][ED.end[0]] > 0 || endarray[ED.id[1]][ED.end[1]] > 0)
      continue; //one of these endpoints has already been join to a closer end
    if (endarray[ED.id[0]][1 - ED.end[0]] == 0){
      if (endarray[ED.id[1]][1 - ED.end[1]] == 0){//new curve
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = SegsArray.Count()+1;
        ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray.AppendNew();
        SArray.Reserve(4);
        OldCurveJoinSeg& Seg0 = SArray.AppendNew();
        OldCurveJoinSeg& Seg1 = SArray.AppendNew();
        if (ED.end[0]) {
          Seg0.id = ED.id[0];
          Seg0.bRev = false;
          Seg1.id = ED.id[1];
          Seg1.bRev = (ED.end[1]) ? true : false;
        }
        else {
          Seg1.id = ED.id[0];
          Seg1.bRev = false;
          Seg0.id = ED.id[1];
          Seg0.bRev = (ED.end[1]) ? false : true;
        }
      }

      else {

        //second curve is part of an existing sequence. Insert or append first curve.
        ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[endarray[ED.id[1]][1 - ED.end[1]] - 1];
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
          endarray[ED.id[1]][1 - ED.end[1]];

        if (SArray[0].id == ED.id[1]){
          OldCurveJoinSeg Seg;
          Seg.id = ED.id[0];
          Seg.bRev = (ED.end[0]) ? false : true;
          SArray.Insert(0, Seg);
        }
        else {
          OldCurveJoinSeg& Seg = SArray.AppendNew();
          Seg.id = ED.id[0];
          Seg.bRev = (ED.end[0]) ? true : false;
        }
      }
    }
    else if (endarray[ED.id[1]][1 - ED.end[1]] == 0){
      //first curve is part of an existing sequence. Insert or append second curve.
      ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[endarray[ED.id[0]][1 - ED.end[0]] - 1];
      endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
        endarray[ED.id[0]][1 - ED.end[0]];

      if (SArray[0].id == ED.id[0]){
        OldCurveJoinSeg Seg;
        Seg.id = ED.id[1];
        Seg.bRev = (ED.end[1]) ? false : true;
        SArray.Insert(0, Seg);
      }
      else {
        OldCurveJoinSeg& Seg = SArray.AppendNew();
        Seg.id = ED.id[1];
        Seg.bRev = (ED.end[1]) ? true : false;
      }
    }
    else {
      //both are in existing sequences.  join the sequences.
      if (endarray[ED.id[0]][1 - ED.end[0]] == endarray[ED.id[1]][1 - ED.end[1]])
        //closes off this curve
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
        endarray[ED.id[0]][1 - ED.end[0]];
      else {
        int segid0 = endarray[ED.id[0]][1 - ED.end[0]];
        int segid1 = endarray[ED.id[1]][1 - ED.end[1]];
        ON_SimpleArray<OldCurveJoinSeg>& SArray0 = SegsArray[segid0 - 1];
        ON_SimpleArray<OldCurveJoinSeg>& SArray1 = SegsArray[segid1 - 1];
        if (SArray0[0].id == ED.id[0]){
          if (SArray1[0].id == ED.id[1]){
            OldReverseSegs(SArray0);
            int j;
            for (j=0; j<SArray1.Count(); j++){
              if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
              if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
              SArray0.Append(SArray1[j]);
            }
            endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
            SArray1.SetCount(0);
          }
          else {
            int j;
            for (j=0; j<SArray0.Count(); j++){
              if (endarray[SArray0[j].id][0] > 0) endarray[SArray0[j].id][0] = segid1;
              if (endarray[SArray0[j].id][1] > 0) endarray[SArray0[j].id][1] = segid1;
              SArray1.Append(SArray0[j]);
            }
            endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid1;
            SArray0.SetCount(0);
          }
        }
        else if (SArray1[0].id == ED.id[1]){
          int j;
          for (j=0; j<SArray1.Count(); j++){
            if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
            if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
            SArray0.Append(SArray1[j]);
          }
          endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
          SArray1.SetCount(0);
        }
        else {
          OldReverseSegs(SArray1);
          int j;
          for (j=0; j<SArray1.Count(); j++) {
            if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
            if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
            SArray0.Append(SArray1[j]);
          }
          endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
          SArray1.SetCount(0);
        }
      }
    }
  }

  //make polycurves out of sequences

  for (i=0; i<SegsArray.Count(); i++){
    ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[i];
    if (SArray.Count() < 2) continue;
    if (!bPreserveDirection){//if number of reversed segs is more than half, reverse.
      int scount= 0;
      int j;
      for (j=0; j<SArray.Count(); j++) {
        if (SArray[j].bRev)
          scount++;
      }
      if (2*scount > SArray.Count())
        OldReverseSegs(SArray);
    }
    ON_PolyCurve* PC = new ON_PolyCurve(SArray.Count());
    bool pc_added = false;
    int j;
    int min_seg = 0;
    int min_id = -1;
    for (j=0; j<SArray.Count(); j++){
      if (key) 
        (*key)[cmap[SArray[j].id]] = OutCurves.Count();
      ON_Curve* C = IC[SArray[j].id];
      if (min_id < 0 || SArray[j].id < min_id){
        min_id = SArray[j].id;
        min_seg = j;
      }
      if (SArray[j].bRev) C->Reverse();
      if (PC->Count()){
        bool bSet = true;
        if (!ON_ForceMatchCurveEnds(*PC, 1, *C, 0)) {
          ON_3dPoint P = PC->PointAtEnd();
          ON_3dPoint Q = C->PointAtStart();
          P = 0.5*(P+Q);
          if (!PC->SetEndPoint(P) || !C->SetStartPoint(P)) {
            ON_NurbsCurve* NC = C->NurbsCurve();
            if (NC && NC->SetStartPoint(P)){
              delete C;
              C = NC;
            }
            else {
              bSet = false;
              delete NC;
              if (PC->Count()) {
                pc_added = true;
                OutCurves.Append(PC);
              }
              if (key)
                (*key)[cmap[SArray[j].id]]++;
              OutCurves.Append(C);
              int k;
              for (k=j+1; k<SArray.Count(); k++){
                if (key)
                  (*key)[cmap[SArray[k].id]] = OutCurves.Count();
                OutCurves.Append(IC[SArray[k].id]);
              }
              break;
            }
          }
        }
      }
      ON_PolyCurve* pPoly = ON_PolyCurve::Cast(C);
      if( pPoly){
        int si;
        for (si=0; si<pPoly->Count(); si++){
          const ON_Curve* SC = pPoly->SegmentCurve(si);
          ON_Curve* SCCopy = SC->DuplicateCurve();
          if (SCCopy) PC->Append(SCCopy);
        }
        delete pPoly;
      }
      else PC->Append(C);
    }
    if (!PC->Count()) delete PC;
    else if (!pc_added) {
      if (!PC->IsClosed() && PC->IsClosable(join_tol)){
        if (!ON_ForceMatchCurveEnds(*PC, 0, *PC, 1))
          PC->SetEndPoint(PC->PointAtStart());
      }
      if (PC->IsClosed() && min_id >= 0){
        //int sc = PC->SpanCount();
        double t = PC->SegmentDomain(min_seg)[0];
        PC->ChangeClosedCurveSeam(t);
      }

      // 28 October 2010 Dale Lear
      //    I added the RemoveNesting() and SynchronizeSegmentDomains()
      //    lines so Rhino will create higher quality geometry.
      PC->RemoveNesting();
      PC->SynchronizeSegmentDomains();

      OutCurves.Append(PC);
    }
  }

  //add in singletons
  for (i=0; i<IC.Count(); i++){
    if (endarray[i][0] == 0 && endarray[i][1] == 0){
      if (key) (*key)[cmap[i]] = OutCurves.Count();
      OutCurves.Append(IC[i]);
    }
  }

  /* This was added by greg to fix big curves that are nearly, but not quite, closed.
  It causes problems when the curve is tiny.
  for(i=0; i<OutCurves.Count(); i++){
  if(!OutCurves[i]->IsClosed()){
  ON_3dPoint s= OutCurves[i]->PointAtStart();
  ON_3dPoint e = OutCurves[i]->PointAtEnd();
  if(s.DistanceTo(e)<join_tol)
  OutCurves[i]->SetEndPoint( s );			
  }
  }
  */

  //Chuck added this, 1/16/03.
  for(i=0; i<OutCurves.Count(); i++){
    ON_Curve* C = OutCurves[i];
    if (!C || C->IsClosed()) continue;
    if (C->IsClosable(join_tol))
      C->SetEndPoint(C->PointAtStart());
  }

  onfree((void*)endarray);
  onfree((void*)endspace);

  return OutCurves.Count() - count;
}